

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O2

ssize_t __thiscall
sc_core::vcd_sc_fxnum_fast_trace::write
          (vcd_sc_fxnum_fast_trace *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  sc_fxnum_fast *psVar4;
  int iVar5;
  undefined4 in_register_00000034;
  pointer pcVar6;
  size_type __n_00;
  allocator_type local_4a;
  allocator_type local_49;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  if (write(_IO_FILE*)::compdata == '\0') {
    iVar5 = __cxa_guard_acquire(&write(_IO_FILE*)::compdata);
    if (iVar5 != 0) {
      local_48._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_48._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      std::vector<char,_std::allocator<char>_>::vector
                (&write::compdata,0x400,(value_type_conflict *)&local_48,&local_4a);
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::compdata,&__dso_handle)
      ;
      __cxa_guard_release(&write(_IO_FILE*)::compdata);
    }
  }
  if (write(_IO_FILE*)::rawdata == '\0') {
    iVar5 = __cxa_guard_acquire(&write(_IO_FILE*)::rawdata);
    if (iVar5 != 0) {
      local_48._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_48._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
      std::vector<char,_std::allocator<char>_>::vector
                (&write::rawdata,0x400,(value_type_conflict *)&local_48,&local_4a);
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::rawdata,&__dso_handle);
      __cxa_guard_release(&write(_IO_FILE*)::rawdata);
    }
  }
  iVar5 = (this->object->m_params).m_type_params.m_wl;
  if ((ulong)((long)write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) <= (ulong)(long)iVar5) {
    __n_00 = ((long)iVar5 & 0xfffffffffffff000U) + 0x1000;
    local_4a = (allocator_type)0x0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_48,__n_00,
               (value_type_conflict *)&local_4a,&local_49);
    pcVar2 = local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
    pcVar6 = local_48._M_impl.super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
         write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start =
         write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_finish =
         write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar6;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar2;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
    local_4a = (allocator_type)0x0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_48,__n_00,
               (value_type_conflict *)&local_4a,&local_49);
    pcVar2 = local_48._M_impl.super__Vector_impl_data._M_end_of_storage;
    pcVar1 = local_48._M_impl.super__Vector_impl_data._M_finish;
    pcVar6 = local_48._M_impl.super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
         write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48._M_impl.super__Vector_impl_data._M_start =
         write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48._M_impl.super__Vector_impl_data._M_finish =
         write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar6;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar2;
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
    iVar5 = (this->object->m_params).m_type_params.m_wl;
  }
  pcVar6 = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (; 0 < iVar5; iVar5 = iVar5 + -1) {
    sc_dt::sc_fxnum_fast::operator[]((sc_fxnum_fast *)&local_48,(int)this->object);
    bVar3 = sc_dt::sc_fxnum_fast_bitref_r::get((sc_fxnum_fast_bitref_r *)&local_48);
    *pcVar6 = "01"[bVar3];
    pcVar6 = pcVar6 + 1;
  }
  *pcVar6 = '\0';
  vcd_trace::compose_data_line
            (&this->super_vcd_trace,
             write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  fputs(write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start,(FILE *)CONCAT44(in_register_00000034,__fd));
  psVar4 = sc_dt::sc_fxnum_fast::operator=(&this->old_value,this->object);
  return (ssize_t)psVar4;
}

Assistant:

void
vcd_sc_fxnum_fast_trace::write( FILE* f )
{
    static std::vector<char> compdata(1024), rawdata(1024);
    typedef std::vector<char>::size_type size_t;

    if ( compdata.size() <= static_cast<size_t>(object.wl()) ) { // include trailing \0
        size_t sz = ( static_cast<size_t>(object.wl()) + 4096 ) & (~static_cast<size_t>(4096-1));
        std::vector<char>( sz ).swap( compdata ); // resize without copying values
        std::vector<char>( sz ).swap( rawdata );
    }
    char *rawdata_ptr  = &rawdata[0];

    for(int bitindex = object.wl() - 1; bitindex >= 0; -- bitindex )
    {
        *rawdata_ptr ++ = "01"[object[bitindex]];
    }
    *rawdata_ptr = '\0';
    compose_data_line( &rawdata[0], &compdata[0] );

    std::fputs( &compdata[0], f );
    old_value = object;
}